

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::Option(ParsedScene *this,string *name,string *value,FileLoc loc)

{
  int iVar1;
  char *pcVar2;
  string *this_00;
  string nName;
  string local_60;
  string local_40;
  
  anon_unknown_167::normalizeArg(&local_40,name);
  if (this->currentApiState == Uninitialized) {
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    detail::stringPrintfRecursive<char_const(&)[7]>
              (&local_60,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [7])"Option");
    Error(&loc,local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_0036a91d;
LAB_0036a6b5:
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    goto LAB_0036a91d;
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 == 0) {
      *(undefined1 *)(Options + 0xc) = 1;
      goto LAB_0036a91d;
    }
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 == 0) {
      *(undefined1 *)(Options + 0xc) = 0;
      goto LAB_0036a91d;
    }
LAB_0036a7ed:
    pcVar2 = "%s: expected \"true\" or \"false\" for option value";
    name = value;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 0xd) = 1;
        goto LAB_0036a91d;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 0xd) = 0;
        goto LAB_0036a91d;
      }
      goto LAB_0036a7ed;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      if (((value->_M_string_length < 3) || (pcVar2 = (value->_M_dataplus)._M_p, *pcVar2 != '\"'))
         || (pcVar2[value->_M_string_length - 1] != '\"')) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,
                   "%s: expected quoted string for option value",value);
      }
      std::__cxx11::string::substr((ulong)&local_60,(ulong)value);
      this_00 = (string *)(Options + 0x48);
LAB_0036a8c8:
      std::__cxx11::string::operator=(this_00,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_0036a91d;
      goto LAB_0036a6b5;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      if (((value->_M_string_length < 3) || (pcVar2 = (value->_M_dataplus)._M_p, *pcVar2 != '\"'))
         || (pcVar2[value->_M_string_length - 1] != '\"')) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,
                   "%s: expected quoted string for option value",value);
      }
      std::__cxx11::string::substr((ulong)&local_60,(ulong)value);
      this_00 = (string *)(Options + 0x68);
      goto LAB_0036a8c8;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      iVar1 = atoi((value->_M_dataplus)._M_p);
      *(int *)(Options + 4) = iVar1;
      goto LAB_0036a91d;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 0xe) = 1;
        goto LAB_0036a91d;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 0xe) = 0;
        goto LAB_0036a91d;
      }
      goto LAB_0036a7ed;
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 10) = 1;
        goto LAB_0036a91d;
      }
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 == 0) {
        *(undefined1 *)(Options + 10) = 0;
        goto LAB_0036a91d;
      }
      goto LAB_0036a7ed;
    }
    pcVar2 = "%s: unknown option";
  }
  SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
            (&this->super_SceneRepresentation,&loc,pcVar2,name);
LAB_0036a91d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParsedScene::Option(const std::string &name, const std::string &value, FileLoc loc) {
    std::string nName = normalizeArg(name);

    VERIFY_INITIALIZED("Option");
    if (nName == "disablepixeljitter") {
        if (value == "true")
            Options->disablePixelJitter = true;
        else if (value == "false")
            Options->disablePixelJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disablewavelengthjitter") {
        if (value == "true")
            Options->disableWavelengthJitter = true;
        else if (value == "false")
            Options->disableWavelengthJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "msereferenceimage") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceImage = value.substr(1, value.size() - 2);
    } else if (nName == "msereferenceout") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceOutput = value.substr(1, value.size() - 2);
    } else if (nName == "seed") {
        Options->seed = std::atoi(value.c_str());
    } else if (nName == "forcediffuse") {
        if (value == "true")
            Options->forceDiffuse = true;
        else if (value == "false")
            Options->forceDiffuse = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "pixelstats") {
        if (value == "true")
            Options->recordPixelStatistics = true;
        else if (value == "false")
            Options->recordPixelStatistics = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else
        ErrorExitDeferred(&loc, "%s: unknown option", name);
}